

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

int duckdb::DecimalScaleUpCheckOperator::Operation<duckdb::hugeint_t,int>
              (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  hugeint_t input_00;
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  uint8_t in_R9B;
  hugeint_t value;
  string error;
  allocator local_b9;
  hugeint_t local_b8;
  hugeint_t local_a8;
  string local_88;
  string local_68;
  string local_48 [32];
  
  local_b8.upper = input.upper;
  local_b8.lower = input.lower;
  bVar1 = hugeint_t::operator>=(&local_b8,(hugeint_t *)((long)dataptr + 0x20));
  if (!bVar1) {
    local_a8 = hugeint_t::operator-((hugeint_t *)((long)dataptr + 0x20));
    bVar1 = hugeint_t::operator<=(&local_b8,&local_a8);
    if (!bVar1) {
      input_00.upper = local_b8.upper;
      input_00.lower = local_b8.lower;
      iVar2 = Cast::Operation<duckdb::hugeint_t,int>(input_00);
      return iVar2 * *(int *)((long)dataptr + 0x30);
    }
  }
  ::std::__cxx11::string::string
            (local_48,"Casting value \"%s\" to type %s failed: value is out of range!",&local_b9);
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)*(byte *)((long)dataptr + 0x35);
  value.upper._0_1_ = *(undefined1 *)((long)dataptr + 0x34);
  value.lower = local_b8.upper;
  value.upper._1_7_ = 0;
  Decimal::ToString_abi_cxx11_
            (&local_68,(Decimal *)local_b8.lower,value,*(byte *)((long)dataptr + 0x35),in_R9B);
  LogicalType::ToString_abi_cxx11_(&local_88,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            ((string *)&local_a8,(StringUtil *)local_48,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,params_1
            );
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string(local_48);
  iVar2 = HandleVectorCastError::Operation<int>
                    ((string *)&local_a8,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  ::std::__cxx11::string::~string((string *)&local_a8);
  return iVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}